

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O0

void __thiscall Nes_Dmc::recalc_irq(Nes_Dmc *this)

{
  long in_RDI;
  nes_time_t irq;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  iVar1 = 0x40000000;
  if (((*(byte *)(in_RDI + 0x40) & 1) != 0) && (*(int *)(in_RDI + 0x10) != 0)) {
    iVar1 = *(int *)(*(long *)(in_RDI + 0x58) + 0x7ec) + *(int *)(in_RDI + 0x14) +
            ((*(int *)(in_RDI + 0x10) + -1) * 8 + *(int *)(in_RDI + 0x2c) + -1) *
            *(int *)(in_RDI + 0x24) + 1;
  }
  if (iVar1 != *(int *)(in_RDI + 0x3c)) {
    *(int *)(in_RDI + 0x3c) = iVar1;
    Nes_Apu::irq_changed((Nes_Apu *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void Nes_Dmc::recalc_irq()
{
	nes_time_t irq = Nes_Apu::no_irq;
	if ( irq_enabled && length_counter )
		irq = apu->last_dmc_time + delay +
				((length_counter - 1) * 8 + bits_remain - 1) * nes_time_t (period) + 1;
	if ( irq != next_irq ) {
		next_irq = irq;
		apu->irq_changed();
	}
}